

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

string * __thiscall SInputFile::InitStr_abi_cxx11_(string *__return_storage_ptr__,SInputFile *this)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  path local_c0;
  undefined4 local_94;
  iterator local_90;
  undefined1 local_68 [8];
  path relative;
  path canonical;
  SInputFile *this_local;
  
  bVar1 = std::filesystem::exists(&this->full);
  if (bVar1) {
    std::filesystem::canonical((path *)&relative._M_cmpts);
  }
  else {
    std::filesystem::__cxx11::path::lexically_normal();
  }
  if (Options::FileVerbosity == 0) {
LAB_0014624e:
    std::filesystem::__cxx11::path::filename(&local_c0,(path *)&relative._M_cmpts);
    std::filesystem::__cxx11::path::string(__return_storage_ptr__,&local_c0);
    std::filesystem::__cxx11::path::~path(&local_c0);
  }
  else {
    if (Options::FileVerbosity == 1) {
      std::filesystem::__cxx11::path::lexically_proximate((path *)local_68);
      std::filesystem::__cxx11::path::begin(&local_90,(path *)local_68);
      ppVar3 = std::filesystem::__cxx11::path::iterator::operator->(&local_90);
      iVar2 = std::filesystem::__cxx11::path::compare(ppVar3);
      if (iVar2 != 0) {
        std::filesystem::__cxx11::path::operator=((path *)&relative._M_cmpts,(path *)local_68);
      }
      std::filesystem::__cxx11::path::~path((path *)local_68);
    }
    else if (Options::FileVerbosity != 2) goto LAB_0014624e;
    std::filesystem::__cxx11::path::string(__return_storage_ptr__,(path *)&relative._M_cmpts);
  }
  local_94 = 1;
  std::filesystem::__cxx11::path::~path((path *)&relative._M_cmpts);
  return __return_storage_ptr__;
}

Assistant:

std::string SInputFile::InitStr() {
	auto canonical = std::filesystem::exists(full) ? std::filesystem::canonical(full) : full.lexically_normal();
	switch(Options::FileVerbosity) {
		case Options::FNAME_LAUNCH_REL:
			{	// try relative to LaunchDirectory, if outside (starts with "../") then keep absolute
				auto relative = canonical.lexically_proximate(LaunchDirectory);
				if (relative.begin()->compare(DOUBLE_DOT_PARENT)) canonical = std::move(relative);
			}
			[[fallthrough]];
		case Options::FNAME_ABSOLUTE:
			return SJ_force_slash(canonical).string();
		case Options::FNAME_BASE:
		default:
			return canonical.filename().string();
	}
}